

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engine_test.cpp
# Opt level: O0

void __thiscall
Engine_testSetIntegerNoTags_Test::~Engine_testSetIntegerNoTags_Test
          (Engine_testSetIntegerNoTags_Test *this)

{
  void *in_RDI;
  
  ~Engine_testSetIntegerNoTags_Test((Engine_testSetIntegerNoTags_Test *)0x130368);
  operator_delete(in_RDI,0x10);
  return;
}

Assistant:

TEST(Engine, testSetIntegerNoTags) {
    Engine e("test", std::move(std::make_unique<TestHandler>()));
    e.Set("gauge.value", 100);
    const auto &h = e.GetHandlers()[0];
    auto *th = dynamic_cast<TestHandler *>(h.get());
    ASSERT_EQ(1, th->intMeasures.size());
    auto im = th->intMeasures[0];
    ASSERT_EQ("test.gauge.value", im.name);
    ASSERT_EQ(MetricType::Gauge, im.type);
    ASSERT_EQ(1, im.rate);
    ASSERT_EQ(100, im.value);
    ASSERT_EQ(0, im.tags.size());
}